

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstar.cpp
# Opt level: O1

void __thiscall DSDcc::DSDDstar::processHD(DSDDstar *this)

{
  if (this->m_symbolIndexHD == 0x293) {
    reset_header_strings(this);
    (this->m_slowData).radioHeaderIndex = 0;
    (this->m_slowData).textFrameIndex = 0;
    (this->m_slowData).counter = 0;
    (this->m_slowData).radioHeader[0] = '\0';
    (this->m_slowData).radioHeader[1] = '\0';
    (this->m_slowData).radioHeader[2] = '\0';
    (this->m_slowData).radioHeader[3] = '\0';
    (this->m_slowData).radioHeader[4] = '\0';
    (this->m_slowData).radioHeader[5] = '\0';
    (this->m_slowData).radioHeader[6] = '\0';
    (this->m_slowData).radioHeader[7] = '\0';
    (this->m_slowData).radioHeader[8] = '\0';
    (this->m_slowData).radioHeader[9] = '\0';
    (this->m_slowData).radioHeader[10] = '\0';
    (this->m_slowData).radioHeader[0xb] = '\0';
    (this->m_slowData).radioHeader[0xc] = '\0';
    (this->m_slowData).radioHeader[0xd] = '\0';
    (this->m_slowData).radioHeader[0xe] = '\0';
    (this->m_slowData).radioHeader[0xf] = '\0';
    (this->m_slowData).radioHeader[0x10] = '\0';
    (this->m_slowData).radioHeader[0x11] = '\0';
    (this->m_slowData).radioHeader[0x12] = '\0';
    (this->m_slowData).radioHeader[0x13] = '\0';
    (this->m_slowData).radioHeader[0x14] = '\0';
    (this->m_slowData).radioHeader[0x15] = '\0';
    (this->m_slowData).radioHeader[0x16] = '\0';
    (this->m_slowData).radioHeader[0x17] = '\0';
    (this->m_slowData).radioHeader[0x18] = '\0';
    (this->m_slowData).radioHeader[0x19] = '\0';
    (this->m_slowData).radioHeader[0x1a] = '\0';
    (this->m_slowData).radioHeader[0x1b] = '\0';
    (this->m_slowData).radioHeader[0x19] = '\0';
    (this->m_slowData).radioHeader[0x1a] = '\0';
    (this->m_slowData).radioHeader[0x1b] = '\0';
    (this->m_slowData).radioHeader[0x1c] = '\0';
    (this->m_slowData).radioHeader[0x1d] = '\0';
    (this->m_slowData).radioHeader[0x1e] = '\0';
    (this->m_slowData).radioHeader[0x1f] = '\0';
    (this->m_slowData).radioHeader[0x20] = '\0';
    (this->m_slowData).radioHeader[0x21] = '\0';
    (this->m_slowData).radioHeader[0x22] = '\0';
    (this->m_slowData).radioHeader[0x23] = '\0';
    (this->m_slowData).radioHeader[0x24] = '\0';
    (this->m_slowData).radioHeader[0x25] = '\0';
    (this->m_slowData).radioHeader[0x26] = '\0';
    (this->m_slowData).radioHeader[0x27] = '\0';
    (this->m_slowData).radioHeader[0x28] = '\0';
    builtin_strncpy((this->m_slowData).text,"                    ",0x15);
    memset((this->m_slowData).gpsNMEA,0,0x104);
    (this->m_slowData).gpsStart = true;
    (this->m_slowData).locator[0] = ' ';
    (this->m_slowData).locator[1] = ' ';
    (this->m_slowData).locator[2] = ' ';
    (this->m_slowData).locator[3] = ' ';
    (this->m_slowData).locator[4] = ' ';
    (this->m_slowData).locator[5] = ' ';
    *(undefined1 *)((long)&(this->m_slowData).distance + 3) = 0;
    *(undefined8 *)((this->m_slowData).locator + 6) = 0;
    (this->m_slowData).currentDataType = DStarSlowDataNone;
    dstar_header_decode(this);
    init(this,(EVP_PKEY_CTX *)0x0);
    this->m_voiceFrameCount = 0x14;
    this->m_frameType = DStarVoiceFrame;
    this->m_dsdDecoder->m_fsmState = DSDprocessDSTAR;
  }
  else {
    this->m_symbolIndexHD = this->m_symbolIndexHD + 1;
  }
  return;
}

Assistant:

void DSDDstar::processHD()
{
    if (m_symbolIndexHD == 660-1)
    {
        reset_header_strings();
        m_slowData.init();
        dstar_header_decode();
        init(); // init for DSTAR
        m_frameType = DStarVoiceFrame; // we start on a voice frame
        m_voiceFrameCount = 20;        // we start at one frame before sync
        m_dsdDecoder->m_fsmState = DSDDecoder::DSDprocessDSTAR; // go to DSTAR
    }
    else
    {
        m_symbolIndexHD++;
    }
}